

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O1

void __thiscall
Catch::clara::detail::BasicResult<Catch::clara::detail::ParseResultType>::~BasicResult
          (BasicResult<Catch::clara::detail::ParseResultType> *this)

{
  pointer pcVar1;
  
  (this->super_ResultValueBase<Catch::clara::detail::ParseResultType>).super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__BasicResult_001ae118;
  pcVar1 = (this->m_errorMessage)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_errorMessage).field_2) {
    operator_delete(pcVar1);
  }
  (this->super_ResultValueBase<Catch::clara::detail::ParseResultType>).super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__ResultValueBase_001ae170;
  operator_delete(this);
  return;
}

Assistant:

explicit BasicResult( BasicResult<U> const &other )
        :   ResultValueBase<T>( other.type() ),
            m_errorMessage( other.errorMessage() )
        {
            assert( type() != ResultBase::Ok );
        }